

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
ft::vector<char,_ft::allocator<char>_>::vector
          (vector<char,_ft::allocator<char>_> *this,size_type n,value_type *val,
          allocator_type *alloc)

{
  size_type i;
  pointer pcVar1;
  ulong uVar2;
  
  this->m_data = (pointer)0x0;
  this->m_size = n;
  this->m_capacity = n;
  pcVar1 = (pointer)operator_new(n);
  this->m_data = pcVar1;
  for (uVar2 = 0; uVar2 < this->m_size; uVar2 = uVar2 + 1) {
    this->m_data[uVar2] = *val;
  }
  return;
}

Assistant:

explicit vector(size_type n, value_type const & val = value_type(),
				 allocator_type const & alloc = allocator_type()):
		m_data(NULL),
		m_size(n),
		m_capacity(n),
		m_alloc(alloc) {
		this->m_data = this->get_allocator().allocate(n);
		for (size_type i = 0; i < this->size(); ++i)
			this->get_allocator().construct(this->m_data + i, val);
	}